

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

int __thiscall
UnifiedRegex::BeginLoopIfSetInst::Print
          (BeginLoopIfSetInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015d347d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",0x43);
  }
  DebugWriter::Print(w,L"BeginLoopIfSet");
  DebugWriter::Print(w,L"(");
  DebugWriter::Print(w,L"set: ");
  RuntimeCharSet<char16_t>::Print(&(this->super_SetMixin<false>).set,w);
  DebugWriter::Print(w,L", ");
  BeginLoopMixin::Print(&this->super_BeginLoopMixin,w,litbuf_00);
  DebugWriter::Print(w,L", ");
  DebugWriter::Print(w,L"minBodyGroupId: %d, maxBodyGroupId: %d",
                     (ulong)(uint)(this->super_BodyGroupsMixin).minBodyGroupId,
                     (ulong)(uint)(this->super_BodyGroupsMixin).maxBodyGroupId);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015d347d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::SetMixin<false>>
              (&this->super_Inst,w,&this->super_Inst,&this->super_SetMixin<false>,L"SetMixin<false>"
              );
    Inst::PrintBytes<UnifiedRegex::BeginLoopMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BeginLoopMixin,L"BeginLoopMixin");
    Inst::PrintBytes<UnifiedRegex::BodyGroupsMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_BodyGroupsMixin,L"BodyGroupsMixin"
              );
    DebugWriter::Unindent(w);
  }
  return 0x43;
}

Assistant:

int BeginLoopIfSetInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("BeginLoopIfSet");
        PRINT_MIXIN_COMMA(SetMixin<false>);
        PRINT_MIXIN_COMMA(BeginLoopMixin);
        PRINT_MIXIN(BodyGroupsMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(SetMixin<false>);
        PRINT_BYTES(BeginLoopMixin);
        PRINT_BYTES(BodyGroupsMixin);
        PRINT_RE_BYTECODE_END();
    }